

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

bool __thiscall cmGlobalGenerator::GenerateCPackPropertiesFile(cmGlobalGenerator *this)

{
  cmake *pcVar1;
  cmMakefile *this_00;
  bool bVar2;
  char *pcVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  string path;
  string config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  cmCPackPropertiesGenerator cpackPropertiesGenerator;
  cmGeneratedFileStream file;
  long *local_358 [2];
  long local_348 [2];
  string local_338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  cmCPackPropertiesGenerator local_2f8;
  cmGeneratedFileStream local_278;
  
  pcVar1 = this->CMakeInstance;
  this_00 = (*(this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start)->Makefile;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_338,this_00,&local_318,false);
  pcVar3 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
  std::__cxx11::string::string((string *)local_358,pcVar3,(allocator *)&local_278);
  std::__cxx11::string::append((char *)local_358);
  bVar2 = cmsys::SystemTools::FileExists((char *)local_358[0]);
  if ((bVar2) || ((pcVar1->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    cmGeneratedFileStream::cmGeneratedFileStream(&local_278,(char *)local_358[0],false);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"# CPack properties\n",0x13);
    p_Var4 = (pcVar1->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var5 = &(pcVar1->InstalledFiles)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var5) {
      do {
        cmCPackPropertiesGenerator::cmCPackPropertiesGenerator
                  (&local_2f8,this_00,(cmInstalledFile *)(p_Var4 + 2),&local_318);
        cmScriptGenerator::Generate
                  (&local_2f8.super_cmScriptGenerator,(ostream *)&local_278,&local_338,&local_318);
        cmScriptGenerator::~cmScriptGenerator(&local_2f8.super_cmScriptGenerator);
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var5);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
  }
  if (local_358[0] != local_348) {
    operator_delete(local_358[0],local_348[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  return true;
}

Assistant:

bool cmGlobalGenerator::GenerateCPackPropertiesFile()
{
  cmake::InstalledFilesMap const& installedFiles =
    this->CMakeInstance->GetInstalledFiles();

  cmMakefile* mf = this->LocalGenerators[0]->GetMakefile();

  std::vector<std::string> configs;
  std::string config = mf->GetConfigurations(configs, false);

  std::string path = this->CMakeInstance->GetHomeOutputDirectory();
  path += "/CPackProperties.cmake";

  if(!cmSystemTools::FileExists(path.c_str()) && installedFiles.empty())
    {
      return true;
    }

  cmGeneratedFileStream file(path.c_str());
  file << "# CPack properties\n";

  for(cmake::InstalledFilesMap::const_iterator i = installedFiles.begin();
    i != installedFiles.end(); ++i)
    {
    cmInstalledFile const& installedFile = i->second;

    cmCPackPropertiesGenerator cpackPropertiesGenerator(
      mf, installedFile, configs);

    cpackPropertiesGenerator.Generate(file, config, configs);
    }

  return true;
}